

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void preinit_state(lua_State *L,global_State *g)

{
  global_State *g_local;
  lua_State *L_local;
  
  L->l_G = g;
  L->stack = (StkId)0x0;
  L->stacksize = 0;
  L->errorJmp = (lua_longjmp *)0x0;
  L->hook = (lua_Hook)0x0;
  L->hookmask = '\0';
  L->basehookcount = 0;
  L->allowhook = '\x01';
  L->hookcount = L->basehookcount;
  L->openupval = (GCObject *)0x0;
  L->size_ci = 0;
  L->baseCcalls = 0;
  L->nCcalls = 0;
  L->status = '\0';
  L->ci = (CallInfo *)0x0;
  L->base_ci = (CallInfo *)0x0;
  L->savedpc = (Instruction *)0x0;
  L->errfunc = 0;
  (L->l_gt).tt = 0;
  return;
}

Assistant:

static void preinit_state(lua_State*L,global_State*g){
G(L)=g;
L->stack=NULL;
L->stacksize=0;
L->errorJmp=NULL;
L->hook=NULL;
L->hookmask=0;
L->basehookcount=0;
L->allowhook=1;
resethookcount(L);
L->openupval=NULL;
L->size_ci=0;
L->nCcalls=L->baseCcalls=0;
L->status=0;
L->base_ci=L->ci=NULL;
L->savedpc=NULL;
L->errfunc=0;
setnilvalue(gt(L));
}